

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_eng.c
# Opt level: O2

int gost_digests(ENGINE *e,EVP_MD **digest,int **nids,int nid)

{
  GOST_digest **ppGVar1;
  int iVar2;
  EVP_MD *pEVar3;
  long lVar4;
  
  if (digest == (EVP_MD **)0x0) {
    *nids = known_digest_nids;
    iVar2 = 8;
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 4) {
      *(undefined4 *)((long)known_digest_nids + lVar4) =
           *(undefined4 *)(*(long *)((long)gost_digest_array + lVar4 * 2) + 8);
    }
  }
  else {
    iVar2 = 0;
    lVar4 = 0;
    do {
      if (lVar4 == 8) {
        pEVar3 = (EVP_MD *)0x0;
        goto LAB_001122c4;
      }
      ppGVar1 = gost_digest_array + lVar4;
      lVar4 = lVar4 + 1;
    } while ((*ppGVar1)->nid != nid);
    pEVar3 = GOST_init_digest(*ppGVar1);
    iVar2 = 1;
LAB_001122c4:
    *digest = pEVar3;
  }
  return iVar2;
}

Assistant:

static int gost_digests(ENGINE *e, const EVP_MD **digest,
                        const int **nids, int nid)
{
    int i;

    if (!digest) {
        int *n = known_digest_nids;

        *nids = n;
        for (i = 0; i < OSSL_NELEM(gost_digest_array); i++)
            *n++ = gost_digest_array[i]->nid;
        return i;
    }

    for (i = 0; i < OSSL_NELEM(gost_digest_array); i++)
        if (nid == gost_digest_array[i]->nid) {
            *digest = GOST_init_digest(gost_digest_array[i]);
            return 1;
        }
    *digest = NULL;
    return 0;
}